

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

int __thiscall
cmCPackIFWPackage::ConfigureFromComponent(cmCPackIFWPackage *this,cmCPackComponent *component)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmCPackLog *this_01;
  int iVar1;
  char *pcVar2;
  pointer ppcVar3;
  mapped_type *__v;
  size_type sVar4;
  size_type sVar5;
  mapped_type *this_02;
  ostream *poVar6;
  pointer dependence;
  iterator dit;
  pointer __k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  mapped_type *local_1d8;
  string prefix;
  DependenceStruct dep;
  
  if (component == (cmCPackComponent *)0x0) {
    iVar1 = 0;
  }
  else {
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase((string *)&deps,&component->Name);
    std::operator+(&dep.Name,"CPACK_IFW_COMPONENT_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps);
    std::operator+(&prefix,&dep.Name,"_");
    std::__cxx11::string::~string((string *)&dep);
    std::__cxx11::string::~string((string *)&deps);
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::_M_assign((string *)&this->Description);
    std::operator+(&dep.Name,&prefix,"VERSION");
    pcVar2 = GetOption(this,&dep.Name);
    std::__cxx11::string::~string((string *)&dep);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string((string *)&dep,"CPACK_PACKAGE_VERSION",(allocator *)&deps);
      GetOption(this,&dep.Name);
      std::__cxx11::string::~string((string *)&dep);
      std::__cxx11::string::assign((char *)&this->Version);
    }
    else {
      std::__cxx11::string::assign((char *)&this->Version);
    }
    std::operator+(&dep.Name,&prefix,"SCRIPT");
    pcVar2 = GetOption(this,&dep.Name);
    std::__cxx11::string::~string((string *)&dep);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->Script);
    }
    __k = (component->Dependencies).
          super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
          super__Vector_impl_data._M_start;
    ppcVar3 = (component->Dependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (__k != ppcVar3) {
      for (; __k != ppcVar3; __k = __k + 1) {
        __v = std::
              map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
              ::operator[](&this->Generator->ComponentPackages,__k);
        std::
        _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
        ::_M_insert_unique<cmCPackIFWPackage*const&>
                  ((_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                    *)&this->Dependencies,__v);
        ppcVar3 = (component->Dependencies).
                  super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    std::operator+(&dep.Name,&prefix,"DEPENDS");
    pcVar2 = GetOption(this,&dep.Name);
    std::__cxx11::string::~string((string *)&dep);
    if (pcVar2 != (char *)0x0) {
      deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&dep,pcVar2,(allocator *)&local_1d8);
      cmSystemTools::ExpandListArgument(&dep.Name,&deps,false);
      std::__cxx11::string::~string((string *)&dep);
      for (dependence = deps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          dependence !=
          deps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; dependence = dependence + 1) {
        DependenceStruct::DependenceStruct(&dep,dependence);
        sVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                ::count(&this->Generator->Packages,&dep.Name);
        if (sVar4 == 0) {
          sVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                  ::count(&this->Generator->DependentPackages,&dep.Name);
          this_02 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                    ::operator[](&this->Generator->DependentPackages,&dep.Name);
          if (sVar5 == 0) {
            DependenceStruct::operator=(this_02,&dep);
          }
          local_1d8 = this_02;
          std::
          _Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
          ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct*>
                    ((_Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
                      *)&this->AlienDependencies,&local_1d8);
        }
        DependenceStruct::~DependenceStruct(&dep);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&deps);
    }
    std::operator+(&dep.Name,&prefix,"LICENSES");
    pcVar2 = GetOption(this,&dep.Name);
    std::__cxx11::string::~string((string *)&dep);
    if (pcVar2 != (char *)0x0) {
      this_00 = &this->Licenses;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(this_00);
      std::__cxx11::string::string((string *)&dep,pcVar2,(allocator *)&deps);
      cmSystemTools::ExpandListArgument(&dep.Name,this_00,false);
      std::__cxx11::string::~string((string *)&dep);
      if ((*(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
        poVar6 = std::operator<<((ostream *)&dep,(string *)&prefix);
        poVar6 = std::operator<<(poVar6,"LICENSES");
        poVar6 = std::operator<<(poVar6," should contain pairs of <display_name> and <file_path>.");
        std::endl<char,std::char_traits<char>>(poVar6);
        if (this->Generator != (cmCPackIFWGenerator *)0x0) {
          this_01 = (this->Generator->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(this_01,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0x134,(char *)deps.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::~string((string *)&deps);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dep);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(this_00);
      }
    }
    std::operator+(&dep.Name,&prefix,"PRIORITY");
    pcVar2 = GetOption(this,&dep.Name);
    std::__cxx11::string::~string((string *)&dep);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->SortingPriority);
    }
    std::__cxx11::string::assign((char *)&this->Default);
    std::__cxx11::string::assign((char *)&this->Virtual);
    std::__cxx11::string::assign((char *)&this->ForcedInstallation);
    std::__cxx11::string::~string((string *)&prefix);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromComponent(cmCPackComponent *component)
{
  if(!component) return 0;

  // Restore defaul configuration
  DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_"
    + cmsys::SystemTools::UpperCase(component->Name)
    + "_";

  // Display name
  DisplayName = component->DisplayName;

  // Description
  Description = component->Description;

  // Version
  if(const char* optVERSION = GetOption(prefix + "VERSION"))
    {
    Version = optVERSION;
    }
  else if(const char* optPACKAGE_VERSION =
          GetOption("CPACK_PACKAGE_VERSION"))
    {
    Version = optPACKAGE_VERSION;
    }
  else
    {
    Version = "1.0.0";
    }

  // Script
  if (const char* option = GetOption(prefix + "SCRIPT"))
    {
    Script = option;
    }

  // CMake dependencies
  if (!component->Dependencies.empty())
    {
    std::vector<cmCPackComponent*>::iterator dit;
    for(dit = component->Dependencies.begin();
        dit != component->Dependencies.end();
        ++dit)
      {
      Dependencies.insert(Generator->ComponentPackages[*dit]);
      }
    }

  // QtIFW dependencies
  if(const char* option = this->GetOption(prefix + "DEPENDS"))
    {
    std::vector<std::string> deps;
    cmSystemTools::ExpandListArgument(option,
                                      deps);
    for(std::vector<std::string>::iterator
          dit = deps.begin(); dit != deps.end(); ++dit)
      {
      DependenceStruct dep(*dit);
      if (!Generator->Packages.count(dep.Name))
        {
        bool hasDep = Generator->DependentPackages.count(dep.Name) > 0;
        DependenceStruct &depRef =
          Generator->DependentPackages[dep.Name];
        if(!hasDep)
          {
          depRef = dep;
          }
        AlienDependencies.insert(&depRef);
        }
      }
    }

  // Licenses
  if (const char* option = this->GetOption(prefix + "LICENSES"))
    {
    Licenses.clear();
    cmSystemTools::ExpandListArgument( option, Licenses );
    if ( Licenses.size() % 2 != 0 )
      {
      cmCPackLogger(cmCPackLog::LOG_WARNING, prefix << "LICENSES"
        << " should contain pairs of <display_name> and <file_path>."
        << std::endl);
      Licenses.clear();
      }
    }

  // Priority
  if(const char* option = this->GetOption(prefix + "PRIORITY"))
    {
    SortingPriority = option;
    }

  // Default
  Default = component->IsDisabledByDefault ? "false" : "true";

  // Virtual
  Virtual = component->IsHidden ? "true" : "";

  // ForcedInstallation
  ForcedInstallation = component->IsRequired ? "true" : "false";

  return 1;
}